

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O1

void cmsysProcess_Interrupt(cmsysProcess *cp)

{
  long lVar1;
  
  if ((((cp != (cmsysProcess *)0x0) && (cp->State == 3)) && (cp->TimeoutExpired == 0)) &&
     (cp->Killed == 0)) {
    if (cp->CreateProcessGroup == 0) {
      kill(0,2);
      return;
    }
    if ((cp->ForkPIDs != (pid_t *)0x0) && (0 < cp->NumberOfCommands)) {
      lVar1 = 0;
      do {
        if (cp->ForkPIDs[lVar1] != 0) {
          kill(-cp->ForkPIDs[lVar1],2);
        }
        lVar1 = lVar1 + 1;
      } while (lVar1 < cp->NumberOfCommands);
    }
  }
  return;
}

Assistant:

void kwsysProcess_Interrupt(kwsysProcess* cp)
{
  int i;
  /* Make sure we are executing a process.  */
  if(!cp || cp->State != kwsysProcess_State_Executing || cp->TimeoutExpired ||
     cp->Killed)
    {
    return;
    }

  /* Interrupt the children.  */
  if (cp->CreateProcessGroup)
    {
    if(cp->ForkPIDs)
      {
      for(i=0; i < cp->NumberOfCommands; ++i)
        {
        /* Make sure the PID is still valid. */
        if(cp->ForkPIDs[i])
          {
          /* The user created a process group for this process.  The group ID
             is the process ID for the original process in the group.  */
          kill(-cp->ForkPIDs[i], SIGINT);
          }
        }
      }
    }
  else
    {
    /* No process group was created.  Kill our own process group.
       NOTE:  While one could argue that we could call kill(cp->ForkPIDs[i],
       SIGINT) as a way to still interrupt the process even though it's not in
       a special group, this is not an option on Windows.  Therefore, we kill
       the current process group for consistency with Windows.  */
    kill(0, SIGINT);
    }
}